

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O1

void lyd_del_move_root(lyd_node **root,lyd_node *to_del,lys_module *mod)

{
  lys_module *plVar1;
  lys_module *plVar2;
  lyd_node *plVar3;
  
  if ((*root != (lyd_node *)0x0) && (plVar1 = lyd_owner_module(*root), plVar1 != mod)) {
    mod = (lys_module *)0x0;
  }
  plVar3 = *root;
  if (plVar3 != to_del) {
    return;
  }
  if (plVar3->parent != (lyd_node_inner *)0x0) {
    return;
  }
  if ((mod == (lys_module *)0x0) || (plVar3->prev->next == (lyd_node *)0x0)) {
LAB_0012902a:
    plVar3 = (*root)->next;
  }
  else {
    if (plVar3->next != (lyd_node *)0x0) {
      plVar1 = lyd_owner_module(to_del);
      plVar2 = lyd_owner_module((*root)->next);
      if (plVar1 == plVar2) goto LAB_0012902a;
    }
    plVar3 = lyd_first_sibling(*root);
  }
  *root = plVar3;
  return;
}

Assistant:

void
lyd_del_move_root(struct lyd_node **root, const struct lyd_node *to_del, const struct lys_module *mod)
{
    if (*root && (lyd_owner_module(*root) != mod)) {
        /* there are no data of mod so this is simply the first top-level sibling */
        mod = NULL;
    }

    if ((*root != to_del) || (*root)->parent) {
        return;
    }

    if (mod && (*root)->prev->next && (!(*root)->next || (lyd_owner_module(to_del) != lyd_owner_module((*root)->next)))) {
        /* there are no more nodes from mod, simply get the first top-level sibling */
        *root = lyd_first_sibling(*root);
    } else {
        *root = (*root)->next;
    }
}